

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image_test.cc
# Opt level: O0

void __thiscall AomImageTest_AomImgAllocNv12_Test::TestBody(AomImageTest_AomImgAllocNv12_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint align;
  aom_img_fmt_t format;
  aom_image_t img;
  int kHeight;
  int kWidth;
  AssertHelper *in_stack_fffffffffffffe30;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int iVar3;
  AssertionResult *this_01;
  uint in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  undefined4 uVar4;
  undefined8 in_stack_fffffffffffffe58;
  Type type;
  aom_image_t *in_stack_fffffffffffffe60;
  AssertionResult *this_02;
  Message *in_stack_fffffffffffffea8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffeb0;
  AssertionResult local_130 [2];
  AssertionResult local_110 [3];
  undefined1 *local_e0;
  aom_image_t *local_d8;
  AssertionResult local_d0;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [168];
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0x80;
  local_10 = 0x80;
  local_bc = 0x107;
  local_c0 = 0x20;
  local_d8 = aom_img_alloc(in_stack_fffffffffffffe60,
                           (aom_img_fmt_t)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                           (uint)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                           in_stack_fffffffffffffe50);
  type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_e0 = local_b8;
  testing::internal::EqHelper::Compare<aom_image_*,_aom_image_*,_nullptr>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (aom_image **)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (aom_image **)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    testing::AssertionResult::failure_message((AssertionResult *)0x3ab5bf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe60,type,
               (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x3ab61c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab671);
  this_02 = local_110;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             (int *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (int *)in_stack_fffffffffffffe30);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab707);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,
               (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar3,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x3ab764);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab7b9);
  this_01 = local_130;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffe40,
             (int *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (int *)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffffe40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3ab85a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffffe50),
               (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe30);
    testing::Message::~Message((Message *)0x3ab8b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab90c);
  this_00 = (AssertionResult *)&stack0xfffffffffffffea8;
  testing::internal::EqHelper::Compare<unsigned_char_*,_std::nullptr_t,_nullptr>
            (&this_01->success_,in_stack_fffffffffffffe40,
             (uchar **)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (void **)this_00);
  iVar3 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0x3ab9a5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,(char *)CONCAT44(uVar4,in_stack_fffffffffffffe50),iVar3,
               in_stack_fffffffffffffe40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x3ab9f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aba40);
  aom_img_free((aom_image_t *)0x3aba4d);
  return;
}

Assistant:

TEST(AomImageTest, AomImgAllocNv12) {
  const int kWidth = 128;
  const int kHeight = 128;

  aom_image_t img;
  aom_img_fmt_t format = AOM_IMG_FMT_NV12;
  unsigned int align = 32;
  EXPECT_EQ(aom_img_alloc(&img, format, kWidth, kHeight, align), &img);
  EXPECT_EQ(img.stride[AOM_PLANE_U], img.stride[AOM_PLANE_Y]);
  EXPECT_EQ(img.stride[AOM_PLANE_V], 0);
  EXPECT_EQ(img.planes[AOM_PLANE_V], nullptr);
  aom_img_free(&img);
}